

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

int __thiscall
sptk::reaper::FdFilter::FilterStream(FdFilter *this,FILE *input_stream,FILE *output_stream)

{
  int iVar1;
  int __c;
  int iVar2;
  size_t sVar3;
  FILE *in_RDX;
  FILE *in_RSI;
  undefined8 *in_RDI;
  int16_t *q;
  int16_t *p;
  int testc;
  int rVal;
  int nread;
  int towrite;
  int toread;
  int j;
  int i;
  undefined2 *local_48;
  undefined2 *local_40;
  int local_30;
  int local_28;
  int local_20;
  int local_1c;
  
  local_30 = 1;
  iVar1 = *(int *)(in_RDI + 0x10);
  *(undefined4 *)(in_RDI + 7) = 1;
  while( true ) {
    sVar3 = fread((void *)in_RDI[1],2,(long)iVar1,in_RSI);
    local_1c = (int)sVar3;
    if (local_1c == 0) break;
    __c = getc(in_RSI);
    iVar2 = feof(in_RSI);
    if (iVar2 == 0) {
      ungetc(__c,in_RSI);
    }
    else {
      *(uint *)(in_RDI + 7) = *(uint *)(in_RDI + 7) | 2;
    }
    if (1 < *(int *)(in_RDI + 0xf)) {
      local_40 = (undefined2 *)(in_RDI[1] + (long)local_1c * 2);
      local_48 = (undefined2 *)(in_RDI[1] + (long)(local_1c * *(int *)(in_RDI + 0xf)) * 2);
      while( true ) {
        local_40 = local_40 + -1;
        if (local_1c == 0) break;
        local_20 = *(int *)(in_RDI + 0xf);
        while( true ) {
          local_20 = local_20 + -1;
          local_48 = local_48 + -1;
          if (local_20 == 0) break;
          *local_48 = 0;
        }
        *local_48 = *local_40;
        local_1c = local_1c + -1;
      }
    }
    FilterBuffer((FdFilter *)output_stream,i,_towrite);
    sVar3 = fwrite((void *)*in_RDI,2,(long)local_28,in_RDX);
    if ((int)sVar3 < local_28) {
      fprintf(_stderr,"Problems writing output in FilterStream\n");
      local_30 = 0;
    }
    *(undefined4 *)(in_RDI + 7) = 0;
  }
  return local_30;
}

Assistant:

int FdFilter::FilterStream(FILE *input_stream, FILE *output_stream) {
  int i, j;
  int  toread, towrite, nread, rVal = 1, testc;

  toread = max_input_;
  filter_state_ = 1;  // indicate start of new signal
  /* process data from a stream */
  while ((nread = fread(input_buffer_, sizeof(*input_buffer_), toread,
                        input_stream))) {
    testc = getc(input_stream);
    if (feof(input_stream))
      filter_state_ |= 2;
    else
      ungetc(testc, input_stream);
    if (insert_ > 1) {
      int16_t *p, *q;
      for (p = input_buffer_ + nread - 1,
               q = input_buffer_ + (nread * insert_) - 1, i = nread; i--;) {
        for (j = insert_ - 1; j--;) *q-- = 0;
        *q-- = *p--;
      }
    }
    FilterBuffer(nread*insert_, &towrite);
    if ((i = fwrite(output_buffer_, sizeof(*output_buffer_), towrite,
                    output_stream)) < towrite) {
      fprintf(stderr, "Problems writing output in FilterStream\n");
      rVal = 0;
    }
    filter_state_ = 0;
  }
  return(rVal);
}